

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall
CRegexParser::build_alter
          (CRegexParser *this,re_machine *new_machine,re_machine *lhs,re_machine *rhs)

{
  CRegexParser *in_RCX;
  re_state_id *in_RDX;
  re_state_id *in_RSI;
  CRegexParser *in_RDI;
  
  init_machine(in_RCX,(re_machine *)in_RDI);
  set_trans(in_RDI,*in_RSI,*in_RDX,RE_EPSILON,L'\0');
  set_trans(in_RDI,*in_RSI,in_RCX->next_state_,RE_EPSILON,L'\0');
  set_trans(in_RDI,in_RDX[1],in_RSI[1],RE_EPSILON,L'\0');
  set_trans(in_RDI,*(re_state_id *)&in_RCX->field_0x4,in_RSI[1],RE_EPSILON,L'\0');
  return;
}

Assistant:

void CRegexParser::build_alter(re_machine *new_machine,
                               re_machine *lhs, re_machine *rhs)
{
    /* initialize the new machine */
    init_machine(new_machine);

    /*
     *   Set up an epsilon transition from our new machine's initial state
     *   to the initial state of each submachine 
     */
    set_trans(new_machine->init, lhs->init, RE_EPSILON, 0);
    set_trans(new_machine->init, rhs->init, RE_EPSILON, 0);

    /*
     *   Set up an epsilon transition from the final state of each
     *   submachine to our final state 
     */
    set_trans(lhs->final, new_machine->final, RE_EPSILON, 0);
    set_trans(rhs->final, new_machine->final, RE_EPSILON, 0);
}